

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall list_files::~list_files(list_files *this)

{
  list_files *this_local;
  
  (this->super_action)._vptr_action = (_func_int **)&PTR__list_files_0019ad08;
  std::__cxx11::string::~string((string *)&this->_fsname);
  action::~action(&this->super_action);
  return;
}

Assistant:

virtual ~list_files() { }